

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

int count_wiener_bits(int wiener_win,WienerInfo *wiener_info,WienerInfo *ref_wiener_info)

{
  int iVar1;
  int in_EDI;
  int bits;
  uint16_t in_stack_ffffffffffffffe0;
  uint16_t in_stack_ffffffffffffffe2;
  int iVar2;
  
  iVar2 = 0;
  if (in_EDI == 7) {
    iVar1 = aom_count_primitive_refsubexpfin
                      (0,0,in_stack_ffffffffffffffe2,in_stack_ffffffffffffffe0);
    iVar2 = iVar1 + iVar2;
  }
  iVar1 = aom_count_primitive_refsubexpfin
                    ((uint16_t)((uint)iVar2 >> 0x10),(uint16_t)iVar2,in_stack_ffffffffffffffe2,
                     in_stack_ffffffffffffffe0);
  iVar1 = iVar1 + iVar2;
  iVar2 = aom_count_primitive_refsubexpfin
                    ((uint16_t)((uint)iVar1 >> 0x10),(uint16_t)iVar1,in_stack_ffffffffffffffe2,
                     in_stack_ffffffffffffffe0);
  iVar2 = iVar2 + iVar1;
  if (in_EDI == 7) {
    iVar1 = aom_count_primitive_refsubexpfin
                      ((uint16_t)((uint)iVar2 >> 0x10),(uint16_t)iVar2,in_stack_ffffffffffffffe2,
                       in_stack_ffffffffffffffe0);
    iVar2 = iVar1 + iVar2;
  }
  iVar1 = aom_count_primitive_refsubexpfin
                    ((uint16_t)((uint)iVar2 >> 0x10),(uint16_t)iVar2,in_stack_ffffffffffffffe2,
                     in_stack_ffffffffffffffe0);
  iVar1 = iVar1 + iVar2;
  iVar2 = aom_count_primitive_refsubexpfin
                    ((uint16_t)((uint)iVar1 >> 0x10),(uint16_t)iVar1,in_stack_ffffffffffffffe2,
                     in_stack_ffffffffffffffe0);
  return iVar2 + iVar1;
}

Assistant:

static int count_wiener_bits(int wiener_win, WienerInfo *wiener_info,
                             WienerInfo *ref_wiener_info) {
  int bits = 0;
  if (wiener_win == WIENER_WIN)
    bits += aom_count_primitive_refsubexpfin(
        WIENER_FILT_TAP0_MAXV - WIENER_FILT_TAP0_MINV + 1,
        WIENER_FILT_TAP0_SUBEXP_K,
        ref_wiener_info->vfilter[0] - WIENER_FILT_TAP0_MINV,
        wiener_info->vfilter[0] - WIENER_FILT_TAP0_MINV);
  bits += aom_count_primitive_refsubexpfin(
      WIENER_FILT_TAP1_MAXV - WIENER_FILT_TAP1_MINV + 1,
      WIENER_FILT_TAP1_SUBEXP_K,
      ref_wiener_info->vfilter[1] - WIENER_FILT_TAP1_MINV,
      wiener_info->vfilter[1] - WIENER_FILT_TAP1_MINV);
  bits += aom_count_primitive_refsubexpfin(
      WIENER_FILT_TAP2_MAXV - WIENER_FILT_TAP2_MINV + 1,
      WIENER_FILT_TAP2_SUBEXP_K,
      ref_wiener_info->vfilter[2] - WIENER_FILT_TAP2_MINV,
      wiener_info->vfilter[2] - WIENER_FILT_TAP2_MINV);
  if (wiener_win == WIENER_WIN)
    bits += aom_count_primitive_refsubexpfin(
        WIENER_FILT_TAP0_MAXV - WIENER_FILT_TAP0_MINV + 1,
        WIENER_FILT_TAP0_SUBEXP_K,
        ref_wiener_info->hfilter[0] - WIENER_FILT_TAP0_MINV,
        wiener_info->hfilter[0] - WIENER_FILT_TAP0_MINV);
  bits += aom_count_primitive_refsubexpfin(
      WIENER_FILT_TAP1_MAXV - WIENER_FILT_TAP1_MINV + 1,
      WIENER_FILT_TAP1_SUBEXP_K,
      ref_wiener_info->hfilter[1] - WIENER_FILT_TAP1_MINV,
      wiener_info->hfilter[1] - WIENER_FILT_TAP1_MINV);
  bits += aom_count_primitive_refsubexpfin(
      WIENER_FILT_TAP2_MAXV - WIENER_FILT_TAP2_MINV + 1,
      WIENER_FILT_TAP2_SUBEXP_K,
      ref_wiener_info->hfilter[2] - WIENER_FILT_TAP2_MINV,
      wiener_info->hfilter[2] - WIENER_FILT_TAP2_MINV);
  return bits;
}